

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraEclipseCDT4Generator.cxx
# Opt level: O0

void AppendAttribute(cmXMLWriter *xml,char *keyval)

{
  allocator<char> local_39;
  string local_38;
  char *local_18;
  char *keyval_local;
  cmXMLWriter *xml_local;
  
  local_18 = keyval;
  keyval_local = (char *)xml;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"attribute",&local_39);
  cmXMLWriter::StartElement(xml,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  cmXMLWriter::Attribute<char_const*>((cmXMLWriter *)keyval_local,"key",&local_18);
  cmXMLWriter::Attribute<char_const*>((cmXMLWriter *)keyval_local,"value",&local_18);
  cmXMLWriter::EndElement((cmXMLWriter *)keyval_local);
  return;
}

Assistant:

static void AppendAttribute(cmXMLWriter& xml, const char* keyval)
{
  xml.StartElement("attribute");
  xml.Attribute("key", keyval);
  xml.Attribute("value", keyval);
  xml.EndElement();
}